

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_strncpy(char *dst,int dst_sz,char *src,int _num)

{
  code *pcVar1;
  int iVar2;
  char *pcVar3;
  int local_34;
  int32_t num;
  int32_t max;
  int len;
  int _num_local;
  char *src_local;
  int dst_sz_local;
  char *dst_local;
  
  if (dst == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xd9,"dst");
    pcVar1 = (code *)swi(3);
    pcVar3 = (char *)(*pcVar1)();
    return pcVar3;
  }
  if (src != (char *)0x0) {
    iVar2 = sx__strnlen(src,_num);
    local_34 = dst_sz + -1;
    if (iVar2 < local_34) {
      local_34 = iVar2;
    }
    if (0 < local_34) {
      memcpy(dst,src,(long)local_34);
    }
    dst[local_34] = '\0';
    return dst + local_34;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0xda,"src");
  pcVar1 = (code *)swi(3);
  pcVar3 = (char *)(*pcVar1)();
  return pcVar3;
}

Assistant:

char* sx_strncpy(char* SX_RESTRICT dst, int dst_sz, const char* SX_RESTRICT src, int _num)
{
    sx_assert(dst);
    sx_assert(src);

    const int len = sx__strnlen(src, _num);
    const int32_t max = dst_sz - 1;
    const int32_t num = (len < max ? len : max);
    if (num > 0) {
        sx_memcpy(dst, src, num);
    }
    dst[num] = '\0';

    return &dst[num];
}